

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

bool __thiscall spvtools::opt::analysis::ScalarConstant::IsZero(ScalarConstant *this)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  int *piVar4;
  
  iVar3 = (*(this->super_Constant)._vptr_Constant[0x18])();
  piVar1 = (int *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  piVar2 = *(int **)CONCAT44(extraout_var,iVar3);
  do {
    piVar4 = piVar2;
    if (piVar4 == piVar1) break;
    piVar2 = piVar4 + 1;
  } while (*piVar4 == 0);
  return piVar4 == piVar1;
}

Assistant:

bool IsZero() const override {
    bool is_zero = true;
    for (uint32_t v : words()) {
      if (v != 0) {
        is_zero = false;
        break;
      }
    }
    return is_zero;
  }